

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  int iVar1;
  code *pcVar2;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  secp256k1_fe t;
  secp256k1_fe r;
  secp256k1_fe l;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  secp256k1_fe *in_stack_ffffffffffffff60;
  undefined1 local_78 [48];
  undefined1 local_48 [52];
  int local_14;
  void *local_10;
  void *local_8;
  
  pcVar2 = secp256k1_fe_inv;
  if (in_EDX != 0) {
    pcVar2 = secp256k1_fe_inv_var;
  }
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  (*pcVar2)(local_48,in_RSI);
  if (local_8 != (void *)0x0) {
    memcpy(local_8,local_48,0x30);
  }
  memcpy(&stack0xffffffffffffff58,local_10,0x30);
  iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x13e7e8);
  if (iVar1 == 0) {
    secp256k1_fe_mul(in_stack_ffffffffffffff60,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (secp256k1_fe *)0x13e85c);
    secp256k1_fe_add(in_stack_ffffffffffffff60,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    iVar1 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x13e873);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xce9,"test condition failed: secp256k1_fe_normalizes_to_zero(&t)");
      abort();
    }
    memcpy(local_78,local_10,0x30);
    secp256k1_fe_add(in_stack_ffffffffffffff60,
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x13e8ee);
    if (iVar1 == 0) {
      pcVar2 = secp256k1_fe_inv;
      if (local_14 != 0) {
        pcVar2 = secp256k1_fe_inv_var;
      }
      (*pcVar2)(local_78);
      secp256k1_fe_add(in_stack_ffffffffffffff60,
                       (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                      );
      pcVar2 = secp256k1_fe_inv;
      if (local_14 != 0) {
        pcVar2 = secp256k1_fe_inv_var;
      }
      (*pcVar2)(local_48);
      secp256k1_fe_add_int(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      secp256k1_fe_add(in_stack_ffffffffffffff60,
                       (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                      );
      iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x13e97d);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
                ,0xcf2,"test condition failed: secp256k1_fe_normalizes_to_zero_var(&l)");
        abort();
      }
    }
  }
  else {
    iVar1 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x13e7f9);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xce4,"test condition failed: secp256k1_fe_normalizes_to_zero(&l)");
      abort();
    }
  }
  return;
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}